

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O2

bool __thiscall pstore::indirect_string::equal_contents(indirect_string *this,indirect_string *rhs)

{
  bool bVar1;
  shared_sstring_view rhs_owner;
  shared_sstring_view lhs_owner;
  sstring_view<std::shared_ptr<const_char>_> local_88;
  raw_sstring_view local_68;
  sstring_view<std::shared_ptr<const_char>_> local_58;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_38;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  raw_sstring_view local_28;
  
  local_30.ptr_ = &local_58;
  local_58.size_ = 0;
  local_88.size_ = 0;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  local_68 = as_string_view(this,local_30);
  local_38.ptr_ = &local_88;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_38);
  local_28 = as_string_view(rhs,local_38);
  bVar1 = pstore::operator==(&local_68,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool indirect_string::equal_contents (indirect_string const & rhs) const {
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) == rhs.as_string_view (&rhs_owner);
    }